

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O0

void init_windows(testloop_handlers *handlers)

{
  char *local_118;
  undefined4 local_110;
  undefined4 local_108;
  Am_Style *local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  Am_Time *local_a8;
  Am_Style *local_a0;
  Am_Drawonable *local_98;
  undefined1 *local_90;
  Am_Drawonable *local_88;
  Am_Style *local_80;
  Am_Drawonable *local_78;
  undefined1 *local_70;
  Am_Drawonable *local_68;
  Am_Style *local_60;
  Am_Drawonable *local_58;
  undefined1 *local_50;
  Am_Drawonable *local_48;
  Am_Time local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [24];
  Am_Style local_18 [8];
  testloop_handlers *local_10;
  testloop_handlers *handlers_local;
  
  local_10 = handlers;
  root = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  local_60 = local_18;
  local_58 = root;
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  local_100 = local_60;
  local_118 = "";
  local_b0 = 0;
  local_b8 = 1;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 1;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 1;
  local_f0 = 1;
  local_f8 = 0;
  local_108 = 0;
  local_110 = 1;
  local_50 = (undefined1 *)&local_118;
  d1 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_58)(local_58,0x352,0xb4,0xdc,0xb4,"D1");
  local_48 = d1;
  Am_Style::~Am_Style(local_18);
  local_78 = d1;
  local_80 = local_30;
  Am_Style::Am_Style(local_80,(Am_Style *)&Am_No_Style);
  local_100 = local_80;
  local_118 = "D2 Icon";
  local_b0 = 0;
  local_b8 = 1;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 1;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 1;
  local_f0 = 1;
  local_f8 = 0;
  local_108 = 0;
  local_110 = 1;
  local_70 = (undefined1 *)&local_118;
  d2 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_78)(local_78,0xfffffff1,100,0xaf,100,"D2");
  local_68 = d2;
  Am_Style::~Am_Style(local_30);
  local_98 = d2;
  local_a0 = local_38;
  Am_Style::Am_Style(local_a0,(Am_Style *)&Am_No_Style);
  local_100 = local_a0;
  local_118 = "";
  local_b0 = 0;
  local_b8 = 1;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 1;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 1;
  local_f0 = 1;
  local_f8 = 0;
  local_108 = 0;
  local_110 = 1;
  local_90 = (undefined1 *)&local_118;
  d3 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_98)(local_98,0x1e,0x12,0x96,100,"D3");
  local_88 = d3;
  Am_Style::~Am_Style(local_38);
  (**(code **)(*(long *)d1 + 0x1b0))(d1,local_10);
  (**(code **)(*(long *)d2 + 0x1b0))(d2,local_10);
  (**(code **)(*(long *)d3 + 0x1b0))(d3,local_10);
  (**(code **)(*(long *)d1 + 0xa0))();
  local_a8 = local_40;
  Am_Time::Am_Time(local_a8,0);
  Am_Drawonable::Process_Event(local_a8);
  Am_Time::~Am_Time(local_40);
  return;
}

Assistant:

void
init_windows(testloop_handlers &handlers)
{

  // Am_Debug_Print_Input_Events = 1;

  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(TESTLOOP_D1_LEFT, 180, 220, 180, "D1");
  d2 = d1->Create(-15, 100, 175, 100, "D2", "D2 Icon", true, false, Am_No_Style,
                  false, 1, 1, 0, 0,
                  // want a title-bar when placed at top-level
                  true);
  d3 = d2->Create(30, 18, 150, 100, "D3");

  d1->Set_Input_Dispatch_Functions(&handlers);
  d2->Set_Input_Dispatch_Functions(&handlers);
  d3->Set_Input_Dispatch_Functions(&handlers);

  d1->Flush_Output();
  d1->Process_Event(0UL);
}